

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract(defV *data,NamedPoint *val)

{
  NamedPoint *this;
  double *pdVar1;
  long *plVar2;
  vector<double,_std::allocator<double>_> *this_00;
  const_reference pvVar3;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this_01;
  size_type sVar4;
  int in_EDX;
  char *in_RSI;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_RDI;
  double dVar5;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vec_1;
  vector<double,_std::allocator<double>_> *vec;
  NamedPoint *in_stack_fffffffffffffef8;
  complex<double> in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string_view in_stack_ffffffffffffffe0;
  
  this = (NamedPoint *)
         CLI::std::
         variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ::index(in_RDI,in_RSI,in_EDX);
  switch(this) {
  case (NamedPoint *)0x0:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (char *)in_stack_fffffffffffffef8);
    pdVar1 = std::
             get<double,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x2b5dcc);
    *(double *)(in_RSI + 0x20) = *pdVar1;
    break;
  case (NamedPoint *)0x1:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (char *)in_stack_fffffffffffffef8);
    plVar2 = std::
             get<long,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x2b5e03);
    *(double *)(in_RSI + 0x20) = (double)*plVar2;
    break;
  case (NamedPoint *)0x2:
  default:
    std::
    get<std::__cxx11::string,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2b5e29);
    std::__cxx11::string::operator_cast_to_basic_string_view(&this->name);
    helicsGetNamedPoint(in_stack_ffffffffffffffe0);
    NamedPoint::operator=(this,in_stack_fffffffffffffef8);
    NamedPoint::~NamedPoint((NamedPoint *)0x2b5e80);
    break;
  case (NamedPoint *)0x3:
    std::
    get<std::complex<double>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2b5e92);
    helicsComplexString_abi_cxx11_(in_stack_ffffffffffffff10);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(&this->name);
    dVar5 = nan("0");
    *(double *)(in_RSI + 0x20) = dVar5;
    break;
  case (NamedPoint *)0x4:
    this_00 = std::
              get<std::vector<double,std::allocator<double>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                        ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                          *)0x2b5f15);
    sVar4 = CLI::std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)this_00);
    if (sVar4 == 1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(&this->name,(char *)in_stack_fffffffffffffef8);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
      *(value_type *)(in_RSI + 0x20) = *pvVar3;
    }
    else {
      helicsVectorString_abi_cxx11_
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff50);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::__cxx11::string::~string(&this->name);
      dVar5 = nan("0");
      *(double *)(in_RSI + 0x20) = dVar5;
    }
    break;
  case (NamedPoint *)0x5:
    dVar5 = nan("0");
    *(double *)(in_RSI + 0x20) = dVar5;
    this_01 = std::
              get<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                        ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                          *)0x2b5fda);
    sVar4 = CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                      ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                       this_01);
    if (sVar4 == 1) {
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                (this_01,0);
      helicsComplexString_abi_cxx11_(in_stack_ffffffffffffff10);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::__cxx11::string::~string(&this->name);
    }
    else {
      helicsComplexVectorString_abi_cxx11_
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_ffffffffffffff50);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::__cxx11::string::~string(&this->name);
    }
    break;
  case (NamedPoint *)0x6:
    std::
    get<helics::NamedPoint,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2b607c);
    NamedPoint::operator=(this,in_stack_fffffffffffffef8);
  }
  return;
}

Assistant:

void valueExtract(const defV& data, NamedPoint& val)
{
    switch (data.index()) {
        case double_loc:  // double
            val.name = "value";
            val.value = std::get<double>(data);
            break;
        case int_loc:  // int64_t
            val.name = "value";
            val.value = static_cast<double>(std::get<int64_t>(data));
            break;
        case string_loc:  // string
        default:
            val = helicsGetNamedPoint(std::get<std::string>(data));
            break;
        case complex_loc:  // complex
            val.name = helicsComplexString(std::get<std::complex<double>>(data));
            val.value = std::nan("0");
            break;
        case vector_loc:  // vector
        {
            const auto& vec = std::get<std::vector<double>>(data);
            if (vec.size() == 1) {
                val.name = "value";
                val.value = vec[0];
            } else {
                val.name = helicsVectorString(vec);
                val.value = std::nan("0");
            }

            break;
        }
        case complex_vector_loc: {
            val.value = std::nan("0");
            const auto& vec = std::get<std::vector<std::complex<double>>>(data);
            if (vec.size() == 1) {
                val.name = helicsComplexString(vec[0]);
            } else {
                val.name = helicsComplexVectorString(vec);
            }
            break;
        }
        case named_point_loc:
            val = std::get<NamedPoint>(data);
            break;
    }
}